

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintexteditsearchwidget.cpp
# Opt level: O2

bool __thiscall
QPlainTextEditSearchWidget::doSearch
          (QPlainTextEditSearchWidget *this,bool searchDown,bool allowRestartAtTop,bool updateUI)

{
  undefined8 uVar1;
  QString *pQVar2;
  MoveMode MVar3;
  char cVar4;
  char cVar5;
  byte bVar6;
  int iVar7;
  int extraout_var;
  QMargins *pQVar8;
  int iVar9;
  QString bgColorCode;
  undefined4 local_190;
  QString fgColorCode;
  QString text;
  QArrayDataPointer<char16_t> local_148;
  QMargins margins;
  QArrayDataPointer<char16_t> local_118;
  QArrayDataPointer<char16_t> local_f8;
  QArrayDataPointer<char16_t> local_d8;
  QArrayDataPointer<char16_t> local_c0;
  QArrayDataPointer<char16_t> local_a8;
  QArrayDataPointer<char16_t> local_90;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_60;
  QArrayDataPointer<char16_t> local_48;
  
  cVar5 = QTimer::isActive();
  if (cVar5 != '\0') {
    stopDebounce(this);
  }
  QLineEdit::text();
  if (text.d.size == 0) {
    if (updateUI) {
      pQVar2 = *(QString **)(*(long *)(this + 0x28) + 8);
      QString::QString(&bgColorCode,(QLatin1String)(ZEXT816(0x142747) << 0x40));
      QWidget::setStyleSheet(pQVar2);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&bgColorCode.d);
    }
    bVar6 = 0;
  }
  else {
    iVar7 = QComboBox::currentIndex();
    bVar6 = QAbstractButton::isChecked();
    cVar5 = !searchDown + '\x04';
    if (iVar7 != 1) {
      cVar5 = !searchDown;
    }
    cVar4 = cVar5 + '\x02';
    if (bVar6 == 0) {
      cVar4 = cVar5;
    }
    local_190 = 1;
    QObject::blockSignals(SUB81(*(undefined8 *)(this + 0x88),0));
    uVar1 = *(undefined8 *)(this + 0x88);
    if (iVar7 == 2) {
      QRegularExpression::QRegularExpression((QRegularExpression *)&bgColorCode,&text,bVar6 ^ 1);
      cVar5 = QPlainTextEdit::find(uVar1,&bgColorCode,cVar4);
      QRegularExpression::~QRegularExpression((QRegularExpression *)&bgColorCode);
    }
    else {
      cVar5 = QPlainTextEdit::find(uVar1,&text,cVar4);
    }
    QObject::blockSignals(SUB81(*(undefined8 *)(this + 0x88),0));
    if (cVar5 == '\0') {
      if (allowRestartAtTop) {
        MVar3 = 0xb;
        if (searchDown) {
          MVar3 = KeepAnchor;
        }
        QPlainTextEdit::moveCursor((MoveOperation)*(undefined8 *)(this + 0x88),MVar3);
        uVar1 = *(undefined8 *)(this + 0x88);
        if (iVar7 == 2) {
          QRegularExpression::QRegularExpression((QRegularExpression *)&bgColorCode,&text,bVar6 ^ 1)
          ;
          bVar6 = QPlainTextEdit::find(uVar1,&bgColorCode,cVar4);
          QRegularExpression::~QRegularExpression((QRegularExpression *)&bgColorCode);
        }
        else {
          bVar6 = QPlainTextEdit::find(uVar1,&text,cVar4);
        }
        if ((bVar6 & updateUI) == 1) {
          if (!searchDown) {
            local_190 = *(undefined4 *)(this + 0x30);
          }
          *(undefined4 *)(this + 0x34) = local_190;
          bVar6 = 1;
          updateSearchCountLabelText(this);
        }
      }
      else {
        bVar6 = 0;
      }
    }
    else {
      iVar7 = (searchDown - 1 | 1) + *(int *)(this + 0x34);
      if (*(int *)(this + 0x30) < iVar7) {
        iVar7 = *(int *)(this + 0x30);
      }
      *(int *)(this + 0x34) = iVar7;
      bVar6 = 1;
      updateSearchCountLabelText(this);
    }
    if (updateUI) {
      QPlainTextEdit::cursorRect();
      QWidget::layout();
      margins = (QMargins)QLayout::contentsMargins();
      iVar9 = *(int *)(*(long *)(this + 0x20) + 0x20) - *(int *)(*(long *)(this + 0x20) + 0x18);
      iVar7 = 0;
      if (*(int *)(*(long *)(*(long *)(this + 0x88) + 0x20) + 0x20) -
          (*(int *)(*(long *)(*(long *)(this + 0x88) + 0x20) + 0x18) + iVar9) < extraout_var) {
        iVar7 = iVar9 + 0xb;
      }
      if (iVar7 != margins.m_bottom) {
        margins.m_bottom = iVar7;
        pQVar8 = (QMargins *)QWidget::layout();
        QLayout::setContentsMargins(pQVar8);
      }
      if (this[0x90] == (QPlainTextEditSearchWidget)0x1) {
        if (bVar6 == 0) {
          bgColorCode.d.ptr = L"#8d2b36";
        }
        else {
          bgColorCode.d.ptr = L"#135a13";
        }
      }
      else if (bVar6 == 0) {
        bgColorCode.d.ptr = L"#FAE9EB";
      }
      else {
        bgColorCode.d.ptr = L"#D5FAE2";
      }
      bgColorCode.d.d = (Data *)0x0;
      bgColorCode.d.size = 7;
      fgColorCode.d.d = (Data *)0x0;
      fgColorCode.d.ptr = (char16_t *)0x0;
      fgColorCode.d.size = 0;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&fgColorCode.d);
      if (this[0x90] == (QPlainTextEditSearchWidget)0x0) {
        fgColorCode.d.ptr = L"#404040";
      }
      else {
        fgColorCode.d.ptr = L"#cccccc";
      }
      fgColorCode.d.d = (Data *)0x0;
      fgColorCode.d.size = 7;
      local_148.d = (Data *)0x0;
      local_148.ptr = (char16_t *)0x0;
      local_148.size = 0;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_148);
      pQVar2 = *(QString **)(*(long *)(this + 0x28) + 8);
      local_48.d = (Data *)0x0;
      local_48.ptr = L"* { background: ";
      local_48.size = 0x10;
      local_d8.d = (Data *)0x0;
      local_d8.ptr = (char16_t *)0x0;
      local_d8.size = 0;
      operator+((QString *)&local_c0,(QString *)&local_48,&bgColorCode);
      local_60.d = (Data *)0x0;
      local_60.ptr = L"; color: ";
      local_60.size = 9;
      local_f8.d = (Data *)0x0;
      local_f8.ptr = (char16_t *)0x0;
      local_f8.size = 0;
      operator+((QString *)&local_a8,(QString *)&local_c0,(QString *)&local_60);
      operator+((QString *)&local_90,(QString *)&local_a8,&fgColorCode);
      local_78.d = (Data *)0x0;
      local_78.ptr = L"; }";
      local_78.size = 3;
      local_118.d = (Data *)0x0;
      local_118.ptr = (char16_t *)0x0;
      local_118.size = 0;
      operator+((QString *)&local_148,(QString *)&local_90,(QString *)&local_78);
      QWidget::setStyleSheet(pQVar2);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_148);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
      setSearchExtraSelections(this);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&fgColorCode.d);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&bgColorCode.d);
    }
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&text.d);
  return (bool)bVar6;
}

Assistant:

bool QPlainTextEditSearchWidget::doSearch(bool searchDown,
                                          bool allowRestartAtTop,
                                          bool updateUI) {
    if (_debounceTimer.isActive()) {
        stopDebounce();
    }

    const QString text = ui->searchLineEdit->text();

    if (text.isEmpty()) {
        if (updateUI) {
            ui->searchLineEdit->setStyleSheet(QLatin1String(""));
        }

        return false;
    }

    const int searchMode = ui->modeComboBox->currentIndex();
    const bool caseSensitive = ui->matchCaseSensitiveButton->isChecked();

    QFlags<QTextDocument::FindFlag> options =
        searchDown ? QTextDocument::FindFlag(0) : QTextDocument::FindBackward;
    if (searchMode == WholeWordsMode) {
        options |= QTextDocument::FindWholeWords;
    }

    if (caseSensitive) {
        options |= QTextDocument::FindCaseSensitively;
    }

    // block signal to reduce too many signals being fired and too many updates
    _textEdit->blockSignals(true);

    bool found =
        searchMode == RegularExpressionMode
            ?
#if (QT_VERSION >= QT_VERSION_CHECK(5, 13, 0))
            _textEdit->find(
                QRegularExpression(
                    text, caseSensitive
                              ? QRegularExpression::NoPatternOption
                              : QRegularExpression::CaseInsensitiveOption),
                options)
            :
#else
            _textEdit->find(QRegExp(text, caseSensitive ? Qt::CaseSensitive
                                                        : Qt::CaseInsensitive),
                            options)
            :
#endif
            _textEdit->find(text, options);

    _textEdit->blockSignals(false);

    if (found) {
        const int result =
            searchDown ? ++_currentSearchResult : --_currentSearchResult;
        _currentSearchResult = std::min(result, _searchResultCount);

        updateSearchCountLabelText();
    }

    // start at the top (or bottom) if not found
    if (!found && allowRestartAtTop) {
        _textEdit->moveCursor(searchDown ? QTextCursor::Start
                                         : QTextCursor::End);
        found =
            searchMode == RegularExpressionMode
                ?
#if (QT_VERSION >= QT_VERSION_CHECK(5, 13, 0))
                _textEdit->find(
                    QRegularExpression(
                        text, caseSensitive
                                  ? QRegularExpression::NoPatternOption
                                  : QRegularExpression::CaseInsensitiveOption),
                    options)
                :
#else
                _textEdit->find(
                    QRegExp(text, caseSensitive ? Qt::CaseSensitive
                                                : Qt::CaseInsensitive),
                    options)
                :
#endif
                _textEdit->find(text, options);

        if (found && updateUI) {
            _currentSearchResult = searchDown ? 1 : _searchResultCount;
            updateSearchCountLabelText();
        }
    }

    if (updateUI) {
        const QRect rect = _textEdit->cursorRect();
        QMargins margins = _textEdit->layout()->contentsMargins();
        const int searchWidgetHotArea = _textEdit->height() - this->height();
        const int marginBottom =
            (rect.y() > searchWidgetHotArea) ? (this->height() + 10) : 0;

        // move the search box a bit up if we would block the search result
        if (margins.bottom() != marginBottom) {
            margins.setBottom(marginBottom);
            _textEdit->layout()->setContentsMargins(margins);
        }

        // add a background color according if we found the text or not
        const QString bgColorCode =
            _darkMode
                ? (found ? QStringLiteral("#135a13")
                         : QStringLiteral("#8d2b36"))
                : found ? QStringLiteral("#D5FAE2") : QStringLiteral("#FAE9EB");
        const QString fgColorCode =
            _darkMode ? QStringLiteral("#cccccc") : QStringLiteral("#404040");

        ui->searchLineEdit->setStyleSheet(
            QStringLiteral("* { background: ") + bgColorCode +
            QStringLiteral("; color: ") + fgColorCode + QStringLiteral("; }"));

        // restore the search extra selections after the find command
        this->setSearchExtraSelections();
    }

    return found;
}